

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void opj_tcd_destroy(opj_tcd_t *tcd)

{
  opj_tcd_t *tcd_local;
  
  if (tcd != (opj_tcd_t *)0x0) {
    opj_tcd_free_tile(tcd);
    if (tcd->tcd_image != (opj_tcd_image_t *)0x0) {
      opj_free(tcd->tcd_image);
      tcd->tcd_image = (opj_tcd_image_t *)0x0;
    }
    opj_free(tcd->used_component);
    opj_free(tcd);
  }
  return;
}

Assistant:

void opj_tcd_destroy(opj_tcd_t *tcd)
{
    if (tcd) {
        opj_tcd_free_tile(tcd);

        if (tcd->tcd_image) {
            opj_free(tcd->tcd_image);
            tcd->tcd_image = 00;
        }

        opj_free(tcd->used_component);

        opj_free(tcd);
    }
}